

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

float ncnn::intersection_area(BBoxRect *a,BBoxRect *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float *in_RSI;
  float *in_RDI;
  float inter_height;
  float inter_width;
  float local_4;
  
  if ((((in_RSI[2] <= *in_RDI && *in_RDI != in_RSI[2]) || (in_RDI[2] < *in_RSI)) ||
      (in_RSI[3] <= in_RDI[1] && in_RDI[1] != in_RSI[3])) || (in_RDI[3] < in_RSI[1])) {
    local_4 = 0.0;
  }
  else {
    pfVar4 = std::min<float>(in_RDI + 2,in_RSI + 2);
    fVar1 = *pfVar4;
    pfVar4 = std::max<float>(in_RDI,in_RSI);
    fVar2 = *pfVar4;
    pfVar4 = std::min<float>(in_RDI + 3,in_RSI + 3);
    fVar3 = *pfVar4;
    pfVar4 = std::max<float>(in_RDI + 1,in_RSI + 1);
    local_4 = (fVar1 - fVar2) * (fVar3 - *pfVar4);
  }
  return local_4;
}

Assistant:

static inline float intersection_area(const BBoxRect& a, const BBoxRect& b)
{
    if (a.xmin > b.xmax || a.xmax < b.xmin || a.ymin > b.ymax || a.ymax < b.ymin)
    {
        // no intersection
        return 0.f;
    }

    float inter_width = std::min(a.xmax, b.xmax) - std::max(a.xmin, b.xmin);
    float inter_height = std::min(a.ymax, b.ymax) - std::max(a.ymin, b.ymin);

    return inter_width * inter_height;
}